

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O1

void __thiscall re2c::Binary::~Binary(Binary *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Cond *pCVar2;
  pointer pcVar3;
  If *pIVar4;
  
  pCVar2 = this->cond;
  if (pCVar2 != (Cond *)0x0) {
    pcVar3 = (pCVar2->compare)._M_dataplus._M_p;
    paVar1 = &(pCVar2->compare).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pCVar2,0x28);
  }
  pIVar4 = this->thn;
  if (pIVar4 != (If *)0x0) {
    If::~If(pIVar4);
    operator_delete(pIVar4,0x10);
  }
  pIVar4 = this->els;
  if (pIVar4 != (If *)0x0) {
    If::~If(pIVar4);
    operator_delete(pIVar4,0x10);
    return;
  }
  return;
}

Assistant:

Binary::~Binary ()
{
	delete cond;
	delete thn;
	delete els;
}